

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_multi_test.c
# Opt level: O3

int multi_dec_simple(MpiDecMultiCtx *data)

{
  MppCtx pvVar1;
  MppApi *pMVar2;
  FileReader reader;
  char cVar3;
  MPP_RET MVar4;
  int iVar5;
  undefined4 uVar6;
  RK_U32 RVar7;
  int iVar8;
  undefined4 uVar9;
  MppBufferGroup pvVar10;
  RK_S64 RVar11;
  MppPacket pvVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  MppFrame pvVar16;
  int iVar17;
  MppFrame frame;
  FileBufSlot *slot;
  int local_90;
  MppFrame local_88;
  uint local_7c;
  undefined4 local_78;
  undefined4 local_74;
  FileBufSlot *local_70;
  RK_U32 local_68;
  int local_64;
  MpiDecMultiCtx *local_60;
  MppPacket local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  MpiDecTestCmd *local_40;
  MppFrame local_38;
  
  local_40 = data->cmd;
  pvVar1 = data->ctx;
  pMVar2 = data->mpi;
  pvVar12 = data->packet;
  reader = local_40->reader;
  local_70 = (FileBufSlot *)0x0;
  iVar14 = data->packet_count;
  RVar7 = data->quiet;
  data->packet_count = iVar14 + 1;
  local_58 = pvVar12;
  MVar4 = reader_index_read(reader,iVar14,&local_70);
  if (MVar4 != MPP_OK) {
    pvVar12 = (MppPacket)0x0;
    _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
               "multi_dec_simple",0x5b);
    if ((DAT_001142d3 & 0x10) != 0) goto LAB_00105204;
  }
  if (local_70 == (FileBufSlot *)0x0) {
    pvVar12 = (MppPacket)0x0;
    _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"slot","multi_dec_simple",
               0x5c);
    if ((DAT_001142d3 & 0x10) != 0) {
LAB_00105204:
      abort();
    }
  }
  local_74 = (undefined4)CONCAT71((int7)((ulong)pvVar12 >> 8),1);
  local_68 = RVar7;
  if (local_70->eos != 0) {
    if ((data->frame_num < 0) || (data->frame_count < data->frame_num)) {
      if (RVar7 == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p loop again\n",0,pvVar1);
      }
      data->packet_count = 0;
    }
    else {
      if (RVar7 == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p found last packet\n",0,pvVar1);
      }
      data->loop_end = 1;
      local_74 = 0;
    }
  }
  pvVar12 = local_58;
  mpp_packet_set_data(local_58,local_70->data);
  mpp_packet_set_size(pvVar12,local_70->size);
  mpp_packet_set_pos(pvVar12,local_70->data);
  mpp_packet_set_length(pvVar12,local_70->size);
  if ((char)local_74 == '\0') {
    mpp_packet_set_eos(local_58);
  }
  uVar15 = 0;
  local_60 = data;
  do {
    if ((int)uVar15 == 0) {
      MVar4 = (*pMVar2->decode_put_packet)(pvVar1,local_58);
      if (MVar4 == MPP_OK) {
        if (data->first_pkt != 0) goto LAB_00104dfd;
        local_7c = 1;
        iVar14 = 0;
        RVar11 = mpp_time();
        data->first_pkt = RVar11;
      }
      else {
        local_7c = 0;
        iVar14 = (int)CONCAT71((int7)(uVar15 >> 8),1);
      }
    }
    else {
LAB_00104dfd:
      local_7c = 1;
      iVar14 = 0;
    }
    local_90 = 0;
    cVar3 = (char)local_74;
    iVar17 = 5;
    local_64 = iVar14;
    while( true ) {
      local_88 = (MppFrame)0x0;
      while (MVar4 = (*pMVar2->decode_get_frame)(pvVar1,&local_88), MVar4 == MPP_ERR_TIMEOUT) {
        if (iVar17 < 1) {
          _mpp_log_l(2,"mpi_dec_multi_test","decode_get_frame failed too much time\n",0);
          goto LAB_00105113;
        }
        iVar17 = iVar17 + -1;
        usleep(2000);
      }
      if (MVar4 != MPP_OK) break;
      pvVar16 = local_88;
      if (local_88 != (MppFrame)0x0) {
        local_38 = local_88;
        iVar5 = mpp_frame_get_info_change();
        if (iVar5 == 0) {
          if (data->first_frm == 0) {
            RVar11 = mpp_time();
            data->first_frm = RVar11;
          }
          RVar7 = local_68;
          local_78 = CONCAT31(local_78._1_3_,local_68 != 0);
          iVar5 = mpp_frame_get_errinfo(local_88);
          iVar8 = mpp_frame_get_discard(local_88);
          if (iVar8 == 0 && iVar5 == 0 || (char)local_78 != '\0') {
            data = local_60;
            if (RVar7 == 0) goto LAB_00105039;
          }
          else {
            uVar6 = mpp_frame_get_errinfo(local_88);
            uVar9 = mpp_frame_get_discard(local_88);
            _mpp_log_l(4,"mpi_dec_multi_test","decoder_get_frame get err info:%d discard:%d.\n",0,
                       uVar6,uVar9);
LAB_00105039:
            data = local_60;
            _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get frame %d\n",0,
                       local_60->frame_count);
          }
          data->frame_count = data->frame_count + 1;
          if ((iVar8 == 0 && iVar5 == 0) && data->fp_output != (FILE *)0x0) {
            dump_mpp_frame_to_file(local_88,data->fp_output);
          }
          fps_calc_inc(local_40->fps);
        }
        else {
          uVar6 = mpp_frame_get_width(local_88);
          local_78 = mpp_frame_get_height(local_88);
          local_44 = mpp_frame_get_hor_stride(local_88);
          local_48 = mpp_frame_get_ver_stride(local_88);
          RVar7 = mpp_frame_get_buf_size(local_88);
          if (local_68 == 0) {
            local_4c = uVar6;
            _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get info changed found\n",0);
            _mpp_log_l(4,"mpi_dec_multi_test",
                       "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,local_4c,
                       local_78,local_44,local_48,RVar7);
          }
          data = local_60;
          pvVar10 = dec_buf_mgr_setup(local_60->buf_mgr,RVar7,0x18,local_40->buf_mode);
          MVar4 = (*pMVar2->control)(pvVar1,MPP_DEC_SET_EXT_BUF_GROUP,pvVar10);
          if (MVar4 != MPP_OK) {
            _mpp_log_l(2,"mpi_dec_multi_test","%p set buffer group failed ret %d\n",0,pvVar1,MVar4);
            goto LAB_00105132;
          }
          data->frm_grp = pvVar10;
          MVar4 = (*pMVar2->control)(pvVar1,MPP_DEC_SET_INFO_CHANGE_READY,(MppParam)0x0);
          if (MVar4 != MPP_OK) {
            pcVar13 = "info change ready failed ret %d\n";
            goto LAB_0010512b;
          }
        }
        local_90 = mpp_frame_get_eos(local_88);
        mpp_frame_deinit(&local_88);
        pvVar16 = local_38;
      }
      if (local_90 == 0 && (cVar3 == '\0' && (char)iVar14 == '\0')) {
        usleep(1000);
        local_90 = 0;
      }
      else {
        iVar5 = data->frame_num;
        if ((0 < iVar5) && (iVar5 <= data->frame_count)) goto LAB_00105132;
        if ((pvVar16 == (MppFrame)0x0) || (iVar5 == 0 && local_90 != 0)) goto LAB_00105132;
      }
    }
LAB_00105113:
    pcVar13 = "decode_get_frame failed ret %d\n";
LAB_0010512b:
    _mpp_log_l(2,"mpi_dec_multi_test",pcVar13,0,MVar4);
LAB_00105132:
    iVar14 = data->frame_num;
    if (iVar14 < 1) {
      if ((iVar14 == 0) && (local_90 != 0)) goto LAB_001051ed;
    }
    else if (iVar14 <= data->frame_count) {
LAB_001051ed:
      data->loop_end = 1;
      return local_64;
    }
    uVar15 = (ulong)local_7c;
    if ((char)local_64 == '\0') {
      return local_64;
    }
    usleep(1000);
  } while( true );
}

Assistant:

static int multi_dec_simple(MpiDecMultiCtx *data)
{
    MpiDecTestCmd *cmd = data->cmd;
    RK_U32 pkt_done = 0;
    RK_U32 pkt_eos  = 0;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    MppPacket packet = data->packet;
    FileReader reader = cmd->reader;
    FileBufSlot *slot = NULL;
    RK_U32 quiet = data->quiet;
    MPP_RET ret = reader_index_read(reader, data->packet_count++, &slot);

    mpp_assert(ret == MPP_OK);
    mpp_assert(slot);

    pkt_eos = slot->eos;

    if (pkt_eos) {
        if (data->frame_num < 0 || data->frame_num > data->frame_count) {
            mpp_log_q(quiet, "%p loop again\n", ctx);
            data->packet_count = 0;
            pkt_eos = 0;
        } else {
            mpp_log_q(quiet, "%p found last packet\n", ctx);
            data->loop_end = 1;
        }
    }

    mpp_packet_set_data(packet, slot->data);
    mpp_packet_set_size(packet, slot->size);
    mpp_packet_set_pos(packet, slot->data);
    mpp_packet_set_length(packet, slot->size);
    // setup eos flag
    if (pkt_eos)
        mpp_packet_set_eos(packet);

    do {
        RK_U32 frm_eos = 0;
        RK_S32 times = 5;
        // send the packet first if packet is not done
        if (!pkt_done) {
            ret = mpi->decode_put_packet(ctx, packet);
            if (MPP_OK == ret) {
                pkt_done = 1;
                if (!data->first_pkt)
                    data->first_pkt = mpp_time();
            }
        }

        // then get all available frame and release
        do {
            RK_S32 get_frm = 0;
            MppFrame frame = NULL;

        try_again:
            ret = mpi->decode_get_frame(ctx, &frame);
            if (MPP_ERR_TIMEOUT == ret) {
                if (times > 0) {
                    times--;
                    msleep(2);
                    goto try_again;
                }
                mpp_err("decode_get_frame failed too much time\n");
            }
            if (ret) {
                mpp_err("decode_get_frame failed ret %d\n", ret);
                break;
            }

            if (frame) {
                if (mpp_frame_get_info_change(frame)) {
                    RK_U32 width = mpp_frame_get_width(frame);
                    RK_U32 height = mpp_frame_get_height(frame);
                    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
                    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
                    RK_U32 buf_size = mpp_frame_get_buf_size(frame);
                    MppBufferGroup grp = NULL;

                    mpp_log_q(quiet, "decode_get_frame get info changed found\n");
                    mpp_log_q(quiet, "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",
                              width, height, hor_stride, ver_stride, buf_size);

                    grp = dec_buf_mgr_setup(data->buf_mgr, buf_size, 24, cmd->buf_mode);
                    /* Set buffer to mpp decoder */
                    ret = mpi->control(ctx, MPP_DEC_SET_EXT_BUF_GROUP, grp);
                    if (ret) {
                        mpp_err("%p set buffer group failed ret %d\n", ctx, ret);
                        break;
                    }
                    data->frm_grp = grp;

                    /*
                     * All buffer group config done. Set info change ready to let
                     * decoder continue decoding
                     */
                    ret = mpi->control(ctx, MPP_DEC_SET_INFO_CHANGE_READY, NULL);
                    if (ret) {
                        mpp_err("info change ready failed ret %d\n", ret);
                        break;
                    }
                } else {
                    RK_U32 err_info = 0;

                    if (!data->first_frm)
                        data->first_frm = mpp_time();

                    err_info = mpp_frame_get_errinfo(frame) |
                               mpp_frame_get_discard(frame);
                    if (err_info) {
                        mpp_log_q(quiet, "decoder_get_frame get err info:%d discard:%d.\n",
                                  mpp_frame_get_errinfo(frame),
                                  mpp_frame_get_discard(frame));
                    }
                    mpp_log_q(quiet, "decode_get_frame get frame %d\n",
                              data->frame_count);

                    data->frame_count++;
                    if (data->fp_output && !err_info)
                        dump_mpp_frame_to_file(frame, data->fp_output);

                    fps_calc_inc(cmd->fps);
                }
                frm_eos = mpp_frame_get_eos(frame);
                mpp_frame_deinit(&frame);
                get_frm = 1;
            }

            // if last packet is send but last frame is not found continue
            if (pkt_eos && pkt_done && !frm_eos) {
                msleep(1);
                continue;
            }

            if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
                ((data->frame_num == 0) && frm_eos))
                break;

            if (get_frm)
                continue;
            break;
        } while (1);

        if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
            ((data->frame_num == 0) && frm_eos)) {
            data->loop_end = 1;
            break;
        }

        if (pkt_done)
            break;

        /*
         * why sleep here:
         * mpi->decode_put_packet will failed when packet in internal queue is
         * full,waiting the package is consumed .Usually hardware decode one
         * frame which resolution is 1080p needs 2 ms,so here we sleep 3ms
         * * is enough.
         */
        msleep(1);
    } while (1);

    return ret;
}